

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall Text::_drawList(Text *this)

{
  wchar_t wVar1;
  ulong uVar2;
  reference pvVar3;
  char *pcVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float h;
  float w;
  float oy;
  float ox;
  texture_glyph_t *glyph;
  float iy;
  float ix;
  size_t j;
  size_t i;
  Text *this_local;
  
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,(this->_texture).id);
  glyph._4_4_ = this->x;
  glyph._0_4_ = this->y;
  j = 0;
  do {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= j) {
      (*glad_glDisable)(0xde1);
      return;
    }
    _oy = (reference)0x0;
    for (_iy = 0; _iy < (this->_font).glyphs_count; _iy = _iy + 1) {
      pvVar3 = std::vector<texture_glyph_t,_std::allocator<texture_glyph_t>_>::operator[]
                         (&(this->_font).glyphs,_iy);
      wVar1 = pvVar3->charcode;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&this->text);
      if (wVar1 == *pcVar4) {
        _oy = std::vector<texture_glyph_t,_std::allocator<texture_glyph_t>_>::operator[]
                        (&(this->_font).glyphs,_iy);
        break;
      }
    }
    if (_oy != (reference)0x0) {
      fVar5 = glyph._4_4_ + (float)_oy->offset_x + this->kerning;
      fVar6 = glyph._0_4_ + (float)_oy->offset_y;
      fVar7 = (float)_oy->width;
      fVar8 = (float)_oy->height;
      (*glad_glBegin)(4);
      (*glad_glColor4f)(1.0,1.0,1.0,1.0);
      (*glad_glTexCoord2f)(_oy->s0,_oy->t0);
      (*glad_glVertex3f)(fVar5,fVar6,this->z);
      (*glad_glTexCoord2f)(_oy->s0,_oy->t1);
      (*glad_glVertex3f)(fVar5,fVar6 - fVar8,this->z);
      (*glad_glTexCoord2f)(_oy->s1,_oy->t1);
      (*glad_glVertex3f)(fVar5 + fVar7,fVar6 - fVar8,this->z);
      (*glad_glTexCoord2f)(_oy->s0,_oy->t0);
      (*glad_glVertex3f)(fVar5,fVar6,this->z);
      (*glad_glTexCoord2f)(_oy->s1,_oy->t1);
      (*glad_glVertex3f)(fVar5 + fVar7,fVar6 - fVar8,this->z);
      (*glad_glTexCoord2f)(_oy->s1,_oy->t0);
      (*glad_glVertex3f)(fVar5 + fVar7,fVar6,this->z);
      (*glad_glEnd)();
      glyph._4_4_ = _oy->advance_x + glyph._4_4_;
      glyph._0_4_ = _oy->advance_y + glyph._0_4_;
    }
    j = j + 1;
  } while( true );
}

Assistant:

void Text::_drawList() {
    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, _texture.id);

    size_t i, j;
    float ix = x, iy = y;
    for(i = 0; i < text.length(); ++i) {
        // Find the glyph
        texture_glyph_t* glyph = 0;
        for(j = 0; j < _font.glyphs_count; ++j) {
            if (_font.glyphs[j].charcode == text[i]) {
                glyph = &_font.glyphs[j];
                break;
            }
        }
        if(!glyph) {
            continue;
        }

        // // Try to dynamically add kerning (NOT WORKING)
        //float k = 0;
        // if (i > 0) {
        //     for (j = 0; j < glyph->kerning_count; ++j) {
        //         //DEBUG_PRINTLN("text[i]: %s text[i-1]: %s", &text[i], &text[i-1]);
        //         if (glyph->kerning[j].codepoint == text[i-1]) {
        //             k = glyph->kerning[j].kerning;
        //             //DEBUG_PRINTLN("text[i]: %d text[i+1]: %d k: %f", &text[i], &text[i-1], k);
        //             break;
        //         }
        //     }
        // }

        // Calculate the size and location based on the current character's glyph
        float ox = ix + glyph->offset_x + kerning;
        float oy = iy + glyph->offset_y;
        float w  = (float)glyph->width;
        float h  = (float)glyph->height;
        
        // Draw the letter
        glBegin(GL_TRIANGLES);
        glColor4f(1.0, 1.0, 1.0, 1.0);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s0, glyph->t1); glVertex3f(ox,     oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s0, glyph->t0); glVertex3f(ox,     oy    , z);
        glTexCoord2f(glyph->s1, glyph->t1); glVertex3f(ox + w, oy - h, z);
        glTexCoord2f(glyph->s1, glyph->t0); glVertex3f(ox + w, oy    , z);
        glEnd();
        
        // Advance to the next letter's position
        ix += glyph->advance_x;
        iy += glyph->advance_y;
    }

    glDisable(GL_TEXTURE_2D);
}